

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void learn_batch(lda *l)

{
  v_array<float> *this;
  base_learner **ppbVar1;
  v_array<float> *this_00;
  float fVar2;
  uint uVar3;
  uint uVar4;
  example **ppeVar5;
  example *peVar6;
  ulong uVar7;
  shared_data *psVar8;
  base_learner *i_00;
  vw *pvVar9;
  parameters *ppVar10;
  parameters *ppVar11;
  uint32_t uVar12;
  byte bVar13;
  size_t k_5;
  vw *pvVar14;
  uint64_t *puVar15;
  weight *pwVar16;
  weight *pwVar17;
  size_t k_1;
  AllReduceType *pAVar18;
  uint32_t *puVar19;
  float *pfVar20;
  size_t i;
  v_array<int> *pvVar21;
  size_t k;
  ulong uVar22;
  ulong uVar23;
  pointer piVar24;
  vw *pvVar25;
  size_t d;
  float fVar26;
  ulong extraout_XMM0_Qa;
  ulong extraout_XMM0_Qa_00;
  ulong extraout_XMM0_Qa_01;
  float local_7c;
  uint64_t *local_78;
  float local_6c;
  float local_68;
  float local_64;
  vw *local_60;
  v_array<int> *local_58;
  parameters *local_50;
  v_array<example_*> *local_48;
  vector<index_feature,_std::allocator<index_feature>_> *local_40;
  v_array<float> *local_38;
  
  if ((l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_start ==
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    for (uVar22 = 0; ppeVar5 = (l->examples)._begin,
        uVar22 < (ulong)((long)(l->examples)._end - (long)ppeVar5 >> 3); uVar22 = uVar22 + 1) {
      v_array<float>::clear(&(ppeVar5[uVar22]->pred).scalars);
      v_array<float>::resize(&((l->examples)._begin[uVar22]->pred).scalars,l->topics);
      memset(((l->examples)._begin[uVar22]->pred).scalars._begin,0,l->topics << 2);
      peVar6 = (l->examples)._begin[uVar22];
      (peVar6->pred).scalars._end = (peVar6->pred).scalars._begin + l->topics;
      v_array<float>::clear(&((l->examples)._begin[uVar22]->pred).scalars);
      return_example(l->all,(l->examples)._begin[uVar22]);
    }
    v_array<example_*>::clear(&l->examples);
    return;
  }
  pvVar14 = l->all;
  local_50 = &pvVar14->weights;
  this_00 = &l->total_lambda;
  local_60 = pvVar14;
  if ((l->total_lambda)._end == (l->total_lambda)._begin) {
    for (uVar22 = 0; uVar22 < pvVar14->lda; uVar22 = uVar22 + 1) {
      local_7c = 0.0;
      v_array<float>::push_back(this_00,&local_7c);
      pvVar14 = l->all;
    }
    bVar13 = (local_60->weights).sparse;
    puVar19 = &(local_60->weights).dense_weights._stride_shift;
    if ((bool)bVar13 != false) {
      puVar19 = &(local_60->weights).sparse_weights._stride_shift;
    }
    uVar12 = *puVar19;
    uVar22 = 0;
    ppVar10 = &local_60->weights;
    ppVar11 = &local_60->weights;
    while( true ) {
      puVar15 = &(ppVar11->dense_weights)._weight_mask;
      if ((bVar13 & 1) != 0) {
        puVar15 = &(ppVar10->sparse_weights)._weight_mask;
      }
      if (*puVar15 < uVar22) break;
      pwVar16 = parameters::operator[](local_50,uVar22);
      for (uVar23 = 0; uVar23 < l->all->lda; uVar23 = uVar23 + 1) {
        this_00->_begin[uVar23] = pwVar16[uVar23] + this_00->_begin[uVar23];
      }
      uVar22 = uVar22 + (uint)(1 << ((byte)uVar12 & 0x1f));
      bVar13 = local_50->sparse;
    }
  }
  local_40 = &l->sorted_features;
  l->example_t = l->example_t + 1.0;
  this = &l->total_new;
  v_array<float>::clear(this);
  uVar22 = 0;
  while( true ) {
    if (l->all->lda <= uVar22) break;
    local_7c = 0.0;
    v_array<float>::push_back(this,&local_7c);
    uVar22 = uVar22 + 1;
  }
  uVar22 = (long)(l->examples)._end - (long)(l->examples)._begin >> 3;
  std::
  __sort<__gnu_cxx::__normal_iterator<index_feature*,std::vector<index_feature,std::allocator<index_feature>>>,__gnu_cxx::__ops::_Iter_less_iter>
            ((l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
             _M_impl.super__Vector_impl_data._M_start,
             (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  local_78._0_4_ = l->all->eta;
  local_68 = lda::powf(l,(float)l->example_t,-l->all->power_t);
  local_68 = local_68 * local_78._0_4_;
  local_64 = 1.0 - local_68;
  local_78._0_4_ = (float)uVar22;
  local_6c = l->lda_D;
  local_48 = (v_array<example_*> *)CONCAT44(local_48._4_4_,(l->decay_levels)._end[-1]);
  local_58 = (v_array<int> *)uVar22;
  local_7c = logf(local_64);
  local_7c = local_7c + local_48._0_4_;
  v_array<float>::push_back(&l->decay_levels,&local_7c);
  v_array<float>::clear(&l->digammas);
  pvVar14 = l->all;
  local_48 = &l->examples;
  local_6c = local_6c / local_78._0_4_;
  uVar22 = (ulong)(uint)local_6c;
  local_78 = (uint64_t *)
             CONCAT44(local_78._4_4_,
                      (float)(ulong)(1L << ((byte)pvVar14->num_bits & 0x3f)) * l->lda_rho);
  local_38 = this_00;
  for (uVar23 = 0; uVar23 < pvVar14->lda; uVar23 = uVar23 + 1) {
    local_7c = lda::digamma(l,(l->total_lambda)._begin[uVar23] + local_78._0_4_);
    v_array<float>::push_back(&l->digammas,&local_7c);
    pvVar14 = l->all;
    uVar22 = extraout_XMM0_Qa;
  }
  uVar23 = 0xffffffffffffffff;
  local_78 = &(local_60->weights).sparse_weights._weight_mask;
  ppVar10 = &local_60->weights;
  pvVar21 = local_58;
  for (piVar24 = (local_40->super__Vector_base<index_feature,_std::allocator<index_feature>_>).
                 _M_impl.super__Vector_impl_data._M_start;
      piVar24 <=
      (l->sorted_features).super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
      .super__Vector_impl_data._M_finish + -1; piVar24 = piVar24 + 1) {
    uVar7 = (piVar24->f).weight_index;
    if (uVar23 != uVar7) {
      puVar15 = &(ppVar10->dense_weights)._weight_mask;
      if ((local_60->weights).sparse != false) {
        puVar15 = local_78;
      }
      pwVar16 = parameters::operator[](local_50,*puVar15 & uVar7);
      pfVar20 = (l->decay_levels)._end;
      fVar26 = expf(pfVar20[-2] -
                    pfVar20[(int)((double)pwVar16[l->all->lda] + (-1.0 - l->example_t))]);
      if (1.0 <= fVar26) {
        fVar26 = 1.0;
      }
      pwVar17 = pwVar16 + l->all->lda;
      *pwVar17 = (float)l->example_t;
      for (uVar22 = 0; uVar22 < l->all->lda; uVar22 = uVar22 + 1) {
        fVar2 = pwVar16[uVar22];
        pwVar16[uVar22] = fVar2 * fVar26;
        (pwVar17 + 1)[uVar22] = fVar2 * fVar26 + l->lda_rho;
      }
      lda::expdigammify_2(l,l->all,pwVar17 + 1,(l->digammas)._begin);
      uVar23 = uVar7;
      pvVar21 = local_58;
      uVar22 = extraout_XMM0_Qa_00;
    }
  }
  local_58 = &l->doc_lengths;
  for (uVar23 = 0; pvVar21 != (v_array<int> *)uVar23; uVar23 = uVar23 + 1) {
    fVar26 = lda_loop(l,&l->Elogtheta,(l->v)._begin + l->all->lda * uVar23,
                      (l->examples)._begin[uVar23],(float)uVar22);
    pvVar14 = l->all;
    if (pvVar14->audit == true) {
      local_78 = (uint64_t *)CONCAT44(local_78._4_4_,fVar26);
      GD::print_audit_features(pvVar14,(l->examples)._begin[uVar23]);
      pvVar14 = l->all;
      fVar26 = local_78._0_4_;
    }
    if (0 < local_58->_begin[uVar23]) {
      pvVar14->sd->sum_loss = pvVar14->sd->sum_loss - (double)fVar26;
      psVar8 = l->all->sd;
      psVar8->sum_loss_since_last_dump = psVar8->sum_loss_since_last_dump - (double)fVar26;
      pvVar14 = l->all;
    }
    return_example(pvVar14,local_48->_begin[uVar23]);
    uVar22 = extraout_XMM0_Qa_01;
  }
  local_68 = local_68 * local_6c;
  if ((local_68 != 0.0) || (NAN(local_68))) {
    pvVar14 = (vw *)(local_40->super__Vector_base<index_feature,_std::allocator<index_feature>_>).
                    _M_impl.super__Vector_impl_data._M_start;
    while (pvVar25 = pvVar14,
          pvVar14 = (vw *)((l->sorted_features).
                           super__Vector_base<index_feature,_std::allocator<index_feature>_>._M_impl
                           .super__Vector_impl_data._M_finish + -1), pvVar25 <= pvVar14) {
      i_00 = (base_learner *)(pvVar25->parse_thread)._M_id._M_thread;
      pvVar9 = pvVar25;
      do {
        pAVar18 = &pvVar9->all_reduce_type;
        if (pvVar14 < pAVar18) break;
        ppbVar1 = &pvVar9->l;
        pvVar9 = (vw *)pAVar18;
      } while (*ppbVar1 == i_00);
      pwVar16 = parameters::operator[](local_50,(size_t)i_00);
      for (uVar22 = 0; uVar23 = (ulong)l->all->lda, local_60 = (vw *)pAVar18, uVar22 < uVar23;
          uVar22 = uVar22 + 1) {
        pwVar16[uVar22] = pwVar16[uVar22] * local_64;
      }
      for (; ppVar10 = local_50, pvVar14 = local_60, local_60 != pvVar25;
          pvVar25 = (vw *)&pvVar25->all_reduce_type) {
        pfVar20 = (l->v)._begin + (uint)((int)uVar23 * *(int *)&pvVar25->sd);
        pwVar16 = parameters::operator[](local_50,(pvVar25->parse_thread)._M_id._M_thread);
        uVar3 = l->all->lda;
        fVar26 = find_cw(l,pwVar16 + (ulong)uVar3 + 1,pfVar20);
        local_78 = (uint64_t *)CONCAT44(local_78._4_4_,fVar26 * local_68 * *(float *)&pvVar25->p);
        pwVar17 = parameters::operator[](ppVar10,(pvVar25->parse_thread)._M_id._M_thread);
        for (uVar22 = 0; uVar4 = l->all->lda, uVar22 < uVar4; uVar22 = uVar22 + 1) {
          fVar26 = (pwVar16 + (ulong)uVar3 + 1)[uVar22] * pfVar20[uVar22] * local_78._0_4_;
          this->_begin[uVar22] = this->_begin[uVar22] + fVar26;
          pwVar17[uVar22] = fVar26 + pwVar17[uVar22];
        }
        uVar23 = (ulong)uVar4;
      }
    }
    for (uVar22 = 0; uVar22 < l->all->lda; uVar22 = uVar22 + 1) {
      local_38->_begin[uVar22] = local_38->_begin[uVar22] * local_64;
      local_38->_begin[uVar22] = this->_begin[uVar22] + local_38->_begin[uVar22];
    }
  }
  std::vector<index_feature,_std::allocator<index_feature>_>::resize(local_40,0);
  v_array<example_*>::clear(local_48);
  v_array<int>::clear(local_58);
  return;
}

Assistant:

void learn_batch(lda &l)
{
  parameters &weights = l.all->weights;
  if (l.sorted_features.empty())  // FAST-PASS for real "true"
  {
    // This can happen when the socket connection is dropped by the client.
    // If l.sorted_features is empty, then l.sorted_features[0] does not
    // exist, so we should not try to take its address in the beginning of
    // the for loops down there. Since it seems that there's not much to
    // do in this case, we just return.
    for (size_t d = 0; d < l.examples.size(); d++)
    {
      l.examples[d]->pred.scalars.clear();
      l.examples[d]->pred.scalars.resize(l.topics);
      memset(l.examples[d]->pred.scalars.begin(), 0, l.topics * sizeof(float));
      l.examples[d]->pred.scalars.end() = l.examples[d]->pred.scalars.begin() + l.topics;

      l.examples[d]->pred.scalars.clear();
      return_example(*l.all, *l.examples[d]);
    }
    l.examples.clear();
    return;
  }

  float eta = -1;
  float minuseta = -1;

  if (l.total_lambda.size() == 0)
  {
    for (size_t k = 0; k < l.all->lda; k++) l.total_lambda.push_back(0.f);
    // This part does not work with sparse parameters
    size_t stride = weights.stride();
    for (size_t i = 0; i <= weights.mask(); i += stride)
    {
      weight *w = &(weights[i]);
      for (size_t k = 0; k < l.all->lda; k++) l.total_lambda[k] += w[k];
    }
  }

  l.example_t++;
  l.total_new.clear();
  for (size_t k = 0; k < l.all->lda; k++) l.total_new.push_back(0.f);

  size_t batch_size = l.examples.size();

  sort(l.sorted_features.begin(), l.sorted_features.end());

  eta = l.all->eta * l.powf((float)l.example_t, -l.all->power_t);
  minuseta = 1.0f - eta;
  eta *= l.lda_D / batch_size;
  l.decay_levels.push_back(l.decay_levels.last() + log(minuseta));

  l.digammas.clear();
  float additional = (float)(l.all->length()) * l.lda_rho;
  for (size_t i = 0; i < l.all->lda; i++) l.digammas.push_back(l.digamma(l.total_lambda[i] + additional));

  uint64_t last_weight_index = -1;
  for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back(); s++)
  {
    if (last_weight_index == s->f.weight_index)
      continue;
    last_weight_index = s->f.weight_index;
    // float *weights_for_w = &(weights[s->f.weight_index]);
    float *weights_for_w = &(weights[s->f.weight_index & weights.mask()]);
    float decay_component =
        l.decay_levels.end()[-2] - l.decay_levels.end()[(int)(-1 - l.example_t + *(weights_for_w + l.all->lda))];
    float decay = fmin(1.0f, correctedExp(decay_component));
    float *u_for_w = weights_for_w + l.all->lda + 1;

    *(weights_for_w + l.all->lda) = (float)l.example_t;
    for (size_t k = 0; k < l.all->lda; k++)
    {
      weights_for_w[k] *= decay;
      u_for_w[k] = weights_for_w[k] + l.lda_rho;
    }

    l.expdigammify_2(*l.all, u_for_w, l.digammas.begin());
  }

  for (size_t d = 0; d < batch_size; d++)
  {
    float score = lda_loop(l, l.Elogtheta, &(l.v[d * l.all->lda]), l.examples[d], l.all->power_t);
    if (l.all->audit)
      GD::print_audit_features(*l.all, *l.examples[d]);
    // If the doc is empty, give it loss of 0.
    if (l.doc_lengths[d] > 0)
    {
      l.all->sd->sum_loss -= score;
      l.all->sd->sum_loss_since_last_dump -= score;
    }
    return_example(*l.all, *l.examples[d]);
  }

  // -t there's no need to update weights (especially since it's a noop)
  if (eta != 0)
  {
    for (index_feature *s = &l.sorted_features[0]; s <= &l.sorted_features.back();)
    {
      index_feature *next = s + 1;
      while (next <= &l.sorted_features.back() && next->f.weight_index == s->f.weight_index) next++;

      float *word_weights = &(weights[s->f.weight_index]);
      for (size_t k = 0; k < l.all->lda; k++, ++word_weights)
      {
        float new_value = minuseta * *word_weights;
        *word_weights = new_value;
      }

      for (; s != next; s++)
      {
        float *v_s = &(l.v[s->document * l.all->lda]);
        float *u_for_w = &(weights[s->f.weight_index]) + l.all->lda + 1;
        float c_w = eta * find_cw(l, u_for_w, v_s) * s->f.x;
        word_weights = &(weights[s->f.weight_index]);
        for (size_t k = 0; k < l.all->lda; k++, ++u_for_w, ++word_weights)
        {
          float new_value = *u_for_w * v_s[k] * c_w;
          l.total_new[k] += new_value;
          *word_weights += new_value;
        }
      }
    }

    for (size_t k = 0; k < l.all->lda; k++)
    {
      l.total_lambda[k] *= minuseta;
      l.total_lambda[k] += l.total_new[k];
    }
  }
  l.sorted_features.resize(0);

  l.examples.clear();
  l.doc_lengths.clear();
}